

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntTest.hpp
# Opt level: O2

void Qentem::Test::PrintDigits<Qentem::BigInt<unsigned_long_long,1024u>>
               (BigInt<unsigned_long_long,_1024U> *b_int,StringStream<char> *stream)

{
  unsigned_long_long uVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 uStack_170;
  char storage [309];
  
  uVar2 = 0;
  storage[0x100] = '\0';
  storage[0x101] = '\0';
  storage[0x102] = '\0';
  storage[0x103] = '\0';
  storage[0x104] = '\0';
  storage[0x105] = '\0';
  storage[0x106] = '\0';
  storage[0x107] = '\0';
  storage[0x108] = '\0';
  storage[0x109] = '\0';
  storage[0x10a] = '\0';
  storage[0x10b] = '\0';
  storage[0x10c] = '\0';
  storage[0x10d] = '\0';
  storage[0x10e] = '\0';
  storage[0x10f] = '\0';
  storage[0x110] = '\0';
  storage[0x111] = '\0';
  storage[0x112] = '\0';
  storage[0x113] = '\0';
  storage[0x114] = '\0';
  storage[0x115] = '\0';
  storage[0x116] = '\0';
  storage[0x117] = '\0';
  storage[0x118] = '\0';
  storage[0x119] = '\0';
  storage[0x11a] = '\0';
  storage[0x11b] = '\0';
  storage[0x11c] = '\0';
  storage[0x11d] = '\0';
  storage[0x11e] = '\0';
  storage[0x11f] = '\0';
  storage[0x120] = '\0';
  storage[0x121] = '\0';
  storage[0x122] = '\0';
  storage[0x123] = '\0';
  storage[0x124] = '\0';
  storage[0x125] = '\0';
  storage[0x126] = '\0';
  storage[0x127] = '\0';
  storage[0x128] = '\0';
  storage[0x129] = '\0';
  storage[0x12a] = '\0';
  storage[299] = '\0';
  storage[300] = '\0';
  storage[0x12d] = '\0';
  storage[0x12e] = '\0';
  storage[0x12f] = '\0';
  storage[0x130] = '\0';
  storage[0x131] = '\0';
  storage[0x132] = '\0';
  storage[0x133] = '\0';
  storage[0x134] = '\0';
  storage[0xc0] = '\0';
  storage[0xc1] = '\0';
  storage[0xc2] = '\0';
  storage[0xc3] = '\0';
  storage[0xc4] = '\0';
  storage[0xc5] = '\0';
  storage[0xc6] = '\0';
  storage[199] = '\0';
  storage[200] = '\0';
  storage[0xc9] = '\0';
  storage[0xca] = '\0';
  storage[0xcb] = '\0';
  storage[0xcc] = '\0';
  storage[0xcd] = '\0';
  storage[0xce] = '\0';
  storage[0xcf] = '\0';
  storage[0xd0] = '\0';
  storage[0xd1] = '\0';
  storage[0xd2] = '\0';
  storage[0xd3] = '\0';
  storage[0xd4] = '\0';
  storage[0xd5] = '\0';
  storage[0xd6] = '\0';
  storage[0xd7] = '\0';
  storage[0xd8] = '\0';
  storage[0xd9] = '\0';
  storage[0xda] = '\0';
  storage[0xdb] = '\0';
  storage[0xdc] = '\0';
  storage[0xdd] = '\0';
  storage[0xde] = '\0';
  storage[0xdf] = '\0';
  storage[0xe0] = '\0';
  storage[0xe1] = '\0';
  storage[0xe2] = '\0';
  storage[0xe3] = '\0';
  storage[0xe4] = '\0';
  storage[0xe5] = '\0';
  storage[0xe6] = '\0';
  storage[0xe7] = '\0';
  storage[0xe8] = '\0';
  storage[0xe9] = '\0';
  storage[0xea] = '\0';
  storage[0xeb] = '\0';
  storage[0xec] = '\0';
  storage[0xed] = '\0';
  storage[0xee] = '\0';
  storage[0xef] = '\0';
  storage[0xf0] = '\0';
  storage[0xf1] = '\0';
  storage[0xf2] = '\0';
  storage[0xf3] = '\0';
  storage[0xf4] = '\0';
  storage[0xf5] = '\0';
  storage[0xf6] = '\0';
  storage[0xf7] = '\0';
  storage[0xf8] = '\0';
  storage[0xf9] = '\0';
  storage[0xfa] = '\0';
  storage[0xfb] = '\0';
  storage[0xfc] = '\0';
  storage[0xfd] = '\0';
  storage[0xfe] = '\0';
  storage[0xff] = '\0';
  storage[0x80] = '\0';
  storage[0x81] = '\0';
  storage[0x82] = '\0';
  storage[0x83] = '\0';
  storage[0x84] = '\0';
  storage[0x85] = '\0';
  storage[0x86] = '\0';
  storage[0x87] = '\0';
  storage[0x88] = '\0';
  storage[0x89] = '\0';
  storage[0x8a] = '\0';
  storage[0x8b] = '\0';
  storage[0x8c] = '\0';
  storage[0x8d] = '\0';
  storage[0x8e] = '\0';
  storage[0x8f] = '\0';
  storage[0x90] = '\0';
  storage[0x91] = '\0';
  storage[0x92] = '\0';
  storage[0x93] = '\0';
  storage[0x94] = '\0';
  storage[0x95] = '\0';
  storage[0x96] = '\0';
  storage[0x97] = '\0';
  storage[0x98] = '\0';
  storage[0x99] = '\0';
  storage[0x9a] = '\0';
  storage[0x9b] = '\0';
  storage[0x9c] = '\0';
  storage[0x9d] = '\0';
  storage[0x9e] = '\0';
  storage[0x9f] = '\0';
  storage[0xa0] = '\0';
  storage[0xa1] = '\0';
  storage[0xa2] = '\0';
  storage[0xa3] = '\0';
  storage[0xa4] = '\0';
  storage[0xa5] = '\0';
  storage[0xa6] = '\0';
  storage[0xa7] = '\0';
  storage[0xa8] = '\0';
  storage[0xa9] = '\0';
  storage[0xaa] = '\0';
  storage[0xab] = '\0';
  storage[0xac] = '\0';
  storage[0xad] = '\0';
  storage[0xae] = '\0';
  storage[0xaf] = '\0';
  storage[0xb0] = '\0';
  storage[0xb1] = '\0';
  storage[0xb2] = '\0';
  storage[0xb3] = '\0';
  storage[0xb4] = '\0';
  storage[0xb5] = '\0';
  storage[0xb6] = '\0';
  storage[0xb7] = '\0';
  storage[0xb8] = '\0';
  storage[0xb9] = '\0';
  storage[0xba] = '\0';
  storage[0xbb] = '\0';
  storage[0xbc] = '\0';
  storage[0xbd] = '\0';
  storage[0xbe] = '\0';
  storage[0xbf] = '\0';
  storage[0x40] = '\0';
  storage[0x41] = '\0';
  storage[0x42] = '\0';
  storage[0x43] = '\0';
  storage[0x44] = '\0';
  storage[0x45] = '\0';
  storage[0x46] = '\0';
  storage[0x47] = '\0';
  storage[0x48] = '\0';
  storage[0x49] = '\0';
  storage[0x4a] = '\0';
  storage[0x4b] = '\0';
  storage[0x4c] = '\0';
  storage[0x4d] = '\0';
  storage[0x4e] = '\0';
  storage[0x4f] = '\0';
  storage[0x50] = '\0';
  storage[0x51] = '\0';
  storage[0x52] = '\0';
  storage[0x53] = '\0';
  storage[0x54] = '\0';
  storage[0x55] = '\0';
  storage[0x56] = '\0';
  storage[0x57] = '\0';
  storage[0x58] = '\0';
  storage[0x59] = '\0';
  storage[0x5a] = '\0';
  storage[0x5b] = '\0';
  storage[0x5c] = '\0';
  storage[0x5d] = '\0';
  storage[0x5e] = '\0';
  storage[0x5f] = '\0';
  storage[0x60] = '\0';
  storage[0x61] = '\0';
  storage[0x62] = '\0';
  storage[99] = '\0';
  storage[100] = '\0';
  storage[0x65] = '\0';
  storage[0x66] = '\0';
  storage[0x67] = '\0';
  storage[0x68] = '\0';
  storage[0x69] = '\0';
  storage[0x6a] = '\0';
  storage[0x6b] = '\0';
  storage[0x6c] = '\0';
  storage[0x6d] = '\0';
  storage[0x6e] = '\0';
  storage[0x6f] = '\0';
  storage[0x70] = '\0';
  storage[0x71] = '\0';
  storage[0x72] = '\0';
  storage[0x73] = '\0';
  storage[0x74] = '\0';
  storage[0x75] = '\0';
  storage[0x76] = '\0';
  storage[0x77] = '\0';
  storage[0x78] = '\0';
  storage[0x79] = '\0';
  storage[0x7a] = '\0';
  storage[0x7b] = '\0';
  storage[0x7c] = '\0';
  storage[0x7d] = '\0';
  storage[0x7e] = '\0';
  storage[0x7f] = '\0';
  storage[0] = '\0';
  storage[1] = '\0';
  storage[2] = '\0';
  storage[3] = '\0';
  storage[4] = '\0';
  storage[5] = '\0';
  storage[6] = '\0';
  storage[7] = '\0';
  storage[8] = '\0';
  storage[9] = '\0';
  storage[10] = '\0';
  storage[0xb] = '\0';
  storage[0xc] = '\0';
  storage[0xd] = '\0';
  storage[0xe] = '\0';
  storage[0xf] = '\0';
  storage[0x10] = '\0';
  storage[0x11] = '\0';
  storage[0x12] = '\0';
  storage[0x13] = '\0';
  storage[0x14] = '\0';
  storage[0x15] = '\0';
  storage[0x16] = '\0';
  storage[0x17] = '\0';
  storage[0x18] = '\0';
  storage[0x19] = '\0';
  storage[0x1a] = '\0';
  storage[0x1b] = '\0';
  storage[0x1c] = '\0';
  storage[0x1d] = '\0';
  storage[0x1e] = '\0';
  storage[0x1f] = '\0';
  storage[0x20] = '\0';
  storage[0x21] = '\0';
  storage[0x22] = '\0';
  storage[0x23] = '\0';
  storage[0x24] = '\0';
  storage[0x25] = '\0';
  storage[0x26] = '\0';
  storage[0x27] = '\0';
  storage[0x28] = '\0';
  storage[0x29] = '\0';
  storage[0x2a] = '\0';
  storage[0x2b] = '\0';
  storage[0x2c] = '\0';
  storage[0x2d] = '\0';
  storage[0x2e] = '\0';
  storage[0x2f] = '\0';
  storage[0x30] = '\0';
  storage[0x31] = '\0';
  storage[0x32] = '\0';
  storage[0x33] = '\0';
  storage[0x34] = '\0';
  storage[0x35] = '\0';
  storage[0x36] = '\0';
  storage[0x37] = '\0';
  storage[0x38] = '\0';
  storage[0x39] = '\0';
  storage[0x3a] = '\0';
  storage[0x3b] = '\0';
  storage[0x3c] = '\0';
  storage[0x3d] = '\0';
  storage[0x3e] = '\0';
  storage[0x3f] = '\0';
  while ((uVar3 = (ulong)uVar2, b_int->index_ != 0 || (b_int->storage_[0] != 0))) {
    uStack_170 = 0x105ae7;
    uVar1 = BigInt<unsigned_long_long,_1024U>::Divide(b_int,10);
    uVar2 = uVar2 + 1;
    storage[uVar3] = (char)uVar1 + '0';
  }
  stream->length_ = 0;
  while (uVar3 != 0) {
    uStack_170 = 0x105b0f;
    StringStream<char>::operator+=(stream,storage[uVar3 - 1]);
    uVar3 = uVar3 - 1;
  }
  return;
}

Assistant:

static void PrintDigits(BigInt_T b_int, StringStream<char> &stream) {
    constexpr unsigned int max = (((b_int.TotalBits() * 30103U) / 100000U) + 1U);
    char                   storage[max]{0};
    unsigned int           index = 0;

    StreamDigits(&(storage[0]), index, b_int);

    stream.Clear();

    while (index != 0) {
        --index;
        stream << storage[index];
    }
}